

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void sysbvm_dictionary_atPut
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
               sysbvm_tuple_t value)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_size_t sVar4;
  sysbvm_tuple_t sVar5;
  size_t capacityThreshold;
  size_t newSize;
  size_t capacity;
  sysbvm_array_t *storage;
  intptr_t elementIndex;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_8173420c gcFrame;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t key_local;
  sysbvm_tuple_t dictionary_local;
  sysbvm_context_t *context_local;
  
  gcFrame.association = (sysbvm_association_t *)value;
  _Var1 = sysbvm_tuple_isNonNullPointer(dictionary);
  if (_Var1) {
    gcFrame.key = (sysbvm_tuple_t)gcFrame.association;
    gcFrame.value = 0;
    gcFrameRecord.roots = (sysbvm_tuple_t *)dictionary;
    gcFrame.dictionary = (sysbvm_dictionary_t *)key;
    memset(&elementIndex,0,0x20);
    gcFrameRecord.previous._0_4_ = 0;
    gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
    gcFrameRecord._12_4_ = 0;
    gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&elementIndex);
    storage = (sysbvm_array_t *)
              sysbvm_dictionary_scanFor
                        (context,(sysbvm_dictionary_t **)&gcFrameRecord.roots,
                         (sysbvm_tuple_t *)&gcFrame);
    if ((long)storage < 0) {
      sysbvm_dictionary_increaseCapacity(context,(sysbvm_dictionary_t **)&gcFrameRecord.roots);
      storage = (sysbvm_array_t *)
                sysbvm_dictionary_scanFor
                          (context,(sysbvm_dictionary_t **)&gcFrameRecord.roots,
                           (sysbvm_tuple_t *)&gcFrame);
      if ((long)storage < 0) {
        sysbvm_error("Dictionary out of memory.");
      }
    }
    sVar5 = gcFrameRecord.roots[3];
    gcFrame.value = *(sysbvm_tuple_t *)(sVar5 + 0x10 + (long)storage * 8);
    if (gcFrame.value == 0) {
      sVar2 = sysbvm_association_create(context,(sysbvm_tuple_t)gcFrame.dictionary,gcFrame.key);
      *(sysbvm_tuple_t *)(sVar5 + 0x10 + (long)storage * 8) = sVar2;
      sVar3 = sysbvm_tuple_getSizeInSlots(gcFrameRecord.roots[3]);
      sVar4 = sysbvm_tuple_size_decode(gcFrameRecord.roots[2]);
      sVar5 = sysbvm_tuple_size_encode(context,sVar4 + 1);
      gcFrameRecord.roots[2] = sVar5;
      if ((sVar3 << 2) / 5 <= sVar4 + 1) {
        sysbvm_dictionary_increaseCapacity(context,(sysbvm_dictionary_t **)&gcFrameRecord.roots);
      }
    }
    else {
      *(sysbvm_tuple_t *)(gcFrame.value + 0x18) = gcFrame.key;
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&elementIndex);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dictionary_atPut(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary)) return;

    struct {
        sysbvm_dictionary_t *dictionary;
        sysbvm_tuple_t key;
        sysbvm_tuple_t value;
        sysbvm_association_t *association;
    } gcFrame = {
        .dictionary = (sysbvm_dictionary_t*)dictionary,
        .key = key,
        .value = value,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    intptr_t elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
    if(elementIndex < 0)
    {
        sysbvm_dictionary_increaseCapacity(context, &gcFrame.dictionary);
        elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_array_t *storage = (sysbvm_array_t*)gcFrame.dictionary->storage;
    gcFrame.association = (sysbvm_association_t*)storage->elements[elementIndex];
    if(gcFrame.association)
    {
        gcFrame.association->value = gcFrame.value;
    }
    else
    {
        storage->elements[elementIndex] = sysbvm_association_create(context, gcFrame.key, gcFrame.value);
        size_t capacity = sysbvm_tuple_getSizeInSlots(gcFrame.dictionary->storage);
        size_t newSize = sysbvm_tuple_size_decode(gcFrame.dictionary->size) + 1;
        gcFrame.dictionary->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 4 / 5;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_dictionary_increaseCapacity(context, &gcFrame.dictionary);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}